

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

Token * __thiscall inja::Lexer::make_token(Token *__return_storage_ptr__,Lexer *this,Kind kind)

{
  size_t in_R8;
  string_view sVar1;
  
  sVar1 = string_view::slice((string_view *)(this->m_in).data_,*(string_view *)&(this->m_in).size_,
                             this->m_pos,in_R8);
  __return_storage_ptr__->kind = kind;
  __return_storage_ptr__->text = sVar1;
  return __return_storage_ptr__;
}

Assistant:

Token make_token(Token::Kind kind) const { return Token(kind, string_view::slice(m_in, m_tok_start, m_pos)); }